

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::addData(TSMuxer *this,uint8_t pesStreamID,int pid,AVPacket *avPacket)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  VodCoreException *this_00;
  uint8_t *puVar5;
  pointer ppVar6;
  bool bVar7;
  int local_204;
  undefined1 local_200 [16];
  pointer local_1e8;
  uint8_t *dst;
  string local_1d8;
  ostringstream local_1a8 [8];
  ostringstream ss;
  int pesHeaderLen;
  int oldLen;
  int beforePesLen;
  AVPacket *avPacket_local;
  int pid_local;
  uint8_t pesStreamID_local;
  TSMuxer *this_local;
  
  _oldLen = avPacket;
  avPacket_local._0_4_ = pid;
  avPacket_local._7_1_ = pesStreamID;
  _pid_local = this;
  sVar4 = MemoryBlock::size(&this->m_pesData);
  pesHeaderLen = (int)sVar4;
  sVar4 = MemoryBlock::size(&this->m_pesData);
  if (sVar4 == 0) {
    buildPesHeader(this,avPacket_local._7_1_,_oldLen,(int)avPacket_local);
    this->m_pesPID = (int)avPacket_local;
    this->m_pesIFrame = (_oldLen->flags & 8) != 0;
    this->m_pesSpsPps = (_oldLen->flags & 0x20) != 0;
  }
  sVar4 = MemoryBlock::size(&this->m_pesData);
  iVar2 = (int)sVar4;
  iVar3 = iVar2 - pesHeaderLen;
  if (iVar2 < 0x5f5e101) {
    MemoryBlock::grow(&this->m_pesData,(long)_oldLen->size);
    puVar5 = MemoryBlock::data(&this->m_pesData);
    local_1e8 = (pointer)(puVar5 + iVar2);
    memcpy(local_1e8,_oldLen->data,(long)_oldLen->size);
    if ((_oldLen->flags & 0x10) != 0) {
      bVar1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::empty
                        (&this->m_priorityData);
      bVar7 = false;
      if (!bVar1) {
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::rbegin
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   &stack0xfffffffffffffe10);
        ppVar6 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)&stack0xfffffffffffffe10);
        iVar2 = ppVar6->first;
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::rbegin
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   (local_200 + 8));
        ppVar6 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(local_200 + 8));
        bVar7 = iVar2 + ppVar6->second == pesHeaderLen;
      }
      if (bVar7) {
        iVar2 = _oldLen->size;
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::rbegin
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_200);
        ppVar6 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)local_200);
        ppVar6->second = iVar2 + iVar3 + ppVar6->second;
      }
      else {
        local_204 = _oldLen->size + iVar3;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   &this->m_priorityData,&pesHeaderLen,&local_204);
      }
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,
                  "Pes packet len too large ( >100Mb). Bad stream or invalid codec speciffed.");
  dst._7_1_ = 1;
  this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  VodCoreException::VodCoreException(this_00,3,&local_1d8);
  dst._7_1_ = 0;
  __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void TSMuxer::addData(const uint8_t pesStreamID, const int pid, AVPacket& avPacket)
{
    int beforePesLen = static_cast<int>(m_pesData.size());
    if (m_pesData.size() == 0)
    {
        buildPesHeader(pesStreamID, avPacket, pid);
        m_pesPID = pid;
        m_pesIFrame = avPacket.flags & AVPacket::IS_IFRAME;
        m_pesSpsPps = avPacket.flags & AVPacket::IS_SPS_PPS_IN_GOP;
    }
    const int oldLen = static_cast<int>(m_pesData.size());
    const int pesHeaderLen = oldLen - beforePesLen;
    if (oldLen > 100000000)
        THROW(ERR_COMMON, "Pes packet len too large ( >100Mb). Bad stream or invalid codec speciffed.")
    m_pesData.grow(avPacket.size /*+ additionDataSize*/);
    uint8_t* dst = m_pesData.data() + oldLen;
    // memcpy(dst, tmpBuffer, additionDataSize);
    memcpy(dst /*+ additionDataSize*/, avPacket.data, avPacket.size);
    if (avPacket.flags & AVPacket::PRIORITY_DATA)
    {
        if (!m_priorityData.empty() && m_priorityData.rbegin()->first + m_priorityData.rbegin()->second == beforePesLen)
            m_priorityData.rbegin()->second += avPacket.size + pesHeaderLen;
        else
            m_priorityData.emplace_back(beforePesLen, avPacket.size + pesHeaderLen);
    }
}